

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FeatureSetDefaults::ByteSizeLong(FeatureSetDefaults *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Edition EVar4;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  reference value;
  uint32_t *puVar5;
  size_t sVar6;
  FeatureSetDefaults_FeatureSetEditionDefault *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  FeatureSetDefaults *this_;
  FeatureSetDefaults *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_defaults_size(this);
  sStack_58 = (size_t)iVar3;
  this_00 = _internal_defaults(this);
  __end3 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::begin
                     (this_00);
  msg = (FeatureSetDefaults_FeatureSetEditionDefault *)
        RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::end
                  (this_00);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value = internal::
            RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
            ::operator*(&__end3);
    sVar6 = internal::WireFormatLite::
            MessageSize<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>(value);
    sStack_58 = sVar6 + sStack_58;
    internal::
    RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::
    operator++(&__end3);
  }
  puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      EVar4 = _internal_minimum_edition(this);
      sVar6 = internal::WireFormatLite::EnumSize(EVar4);
      sStack_58 = sVar6 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      EVar4 = _internal_maximum_edition(this);
      sVar6 = internal::WireFormatLite::EnumSize(EVar4);
      sStack_58 = sVar6 + 1 + sStack_58;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t FeatureSetDefaults::ByteSizeLong() const {
  const FeatureSetDefaults& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FeatureSetDefaults)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault defaults = 1;
    {
      total_size += 1UL * this_._internal_defaults_size();
      for (const auto& msg : this_._internal_defaults()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional .google.protobuf.Edition minimum_edition = 4;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_minimum_edition());
    }
    // optional .google.protobuf.Edition maximum_edition = 5;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_maximum_edition());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}